

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall Polymer::CheckAhead(Polymer *this,int old_stop,int new_stop)

{
  int iVar1;
  pointer pIVar2;
  int iVar3;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  *__range1;
  element_type *peVar4;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval;
  pointer pIVar5;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  intervalVector local_48;
  
  local_48.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (&this->binding_sites_,(long)(old_stop + 1),(long)new_stop,&local_48);
  pIVar2 = local_48.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar5 = local_48.
                super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar5 != pIVar2; pIVar5 = pIVar5 + 1) {
    peVar4 = (pIVar5->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (peVar4->super_FixedElement).start_;
    if (old_stop <= iVar3 && iVar3 < new_stop) {
      iVar1 = (peVar4->super_FixedElement).covered_;
      iVar3 = iVar1 + 1;
      (peVar4->super_FixedElement).covered_ = iVar3;
      if (-1 < iVar1 && (peVar4->super_FixedElement).old_covered_ == 0) {
        LogCover(this,&(peVar4->super_FixedElement).name_);
        peVar4 = (pIVar5->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar3 = (peVar4->super_FixedElement).covered_;
      }
      (peVar4->super_FixedElement).old_covered_ = iVar3;
    }
  }
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void Polymer::CheckAhead(int old_stop, int new_stop) {
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(old_stop + 1, new_stop, results);
  for (auto &interval : results) {
    if (interval.value->start() < new_stop &&
        interval.value->start() >= old_stop) {
      interval.value->Cover();
      if (interval.value->WasCovered()) {
        // Record changes that species was covered
        LogCover(interval.value->name());
      }
      interval.value->ResetState();
    }
  }
}